

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O0

int ffppnd(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,double *array,double nulval,
          int *status)

{
  int iVar1;
  double local_60;
  int *local_58;
  double nullvalue;
  long row;
  int *status_local;
  double nulval_local;
  double *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  row = (long)status;
  status_local = (int *)nulval;
  nulval_local = (double)array;
  array_local = (double *)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_60 = 4.94065645841247e-324;
    }
    else {
      local_60 = (double)firstelem_local;
    }
    nullvalue = local_60;
    ffpcnd((fitsfile *)group_local,2,(LONGLONG)local_60,nelem_local,(LONGLONG)array_local,
           (double *)nulval_local,(double)status_local,(int *)row);
    fptr_local._4_4_ = *(int *)row;
  }
  else {
    local_58 = status_local;
    fits_write_compressed_pixels
              ((fitsfile *)group_local,0x52,nelem_local,(LONGLONG)array_local,1,(void *)nulval_local
               ,&local_58,(int *)row);
    fptr_local._4_4_ = *(int *)row;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffppnd( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to write               */
            double *array,    /* I - array of values that are written        */
            double nulval,    /* I - undefined pixel value                   */
            int  *status)     /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;
    double nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        nullvalue = nulval;  /* set local variable */
        fits_write_compressed_pixels(fptr, TDOUBLE, firstelem, nelem,
            1, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpcnd(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}